

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.h
# Opt level: O0

bool __thiscall
TTD::ThreadContextTTD::ResolveIsLongLivedForExtract(ThreadContextTTD *this,TTD_LOG_PTR_ID origId)

{
  bool *pbVar1;
  bool local_19;
  TTD_LOG_PTR_ID local_18;
  TTD_LOG_PTR_ID origId_local;
  ThreadContextTTD *this_local;
  
  local_19 = false;
  local_18 = origId;
  origId_local = (TTD_LOG_PTR_ID)this;
  pbVar1 = JsUtil::
           BaseDictionary<unsigned_long,_bool,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::LookupWithKey<unsigned_long>(&this->m_ttdMayBeLongLivedRoot,&local_18,&local_19);
  return (bool)(*pbVar1 & 1);
}

Assistant:

bool ResolveIsLongLivedForExtract(TTD_LOG_PTR_ID origId) const { return this->m_ttdMayBeLongLivedRoot.LookupWithKey(origId, false); }